

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_options_common<wchar_t>::basic_json_options_common
          (basic_json_options_common<wchar_t> *this,basic_json_options_common<wchar_t> *param_2)

{
  long in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__basic_json_options_common_0133df40;
  *(undefined2 *)(in_RDI + 1) = *(undefined2 *)(in_RSI + 8);
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 2),(wstring *)(in_RSI + 0x10));
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 6),(wstring *)(in_RSI + 0x30));
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 10),(wstring *)(in_RSI + 0x50));
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 0xe),(wstring *)(in_RSI + 0x70));
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 0x12),(wstring *)(in_RSI + 0x90));
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 0x16),(wstring *)(in_RSI + 0xb0));
  *(undefined4 *)(in_RDI + 0x1a) = *(undefined4 *)(in_RSI + 0xd0);
  return;
}

Assistant:

basic_json_options_common(const basic_json_options_common&) = default;